

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_newc.c
# Opt level: O0

int archive_write_newc_close(archive_write *a)

{
  int iVar1;
  archive_entry *entry;
  archive_entry *trailer;
  int er;
  archive_entry *in_stack_000000d8;
  archive_write *in_stack_000000e0;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  entry = archive_entry_new();
  archive_entry_set_nlink(entry,1);
  archive_entry_set_size(entry,0);
  archive_entry_set_pathname
            ((archive_entry *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
             (char *)entry);
  iVar1 = write_header(in_stack_000000e0,in_stack_000000d8);
  archive_entry_free((archive_entry *)0x178c98);
  return iVar1;
}

Assistant:

static int
archive_write_newc_close(struct archive_write *a)
{
	int er;
	struct archive_entry *trailer;

	trailer = archive_entry_new();
	archive_entry_set_nlink(trailer, 1);
	archive_entry_set_size(trailer, 0);
	archive_entry_set_pathname(trailer, "TRAILER!!!");
	/* Bypass the required data checks. */
	er = write_header(a, trailer);
	archive_entry_free(trailer);
	return (er);
}